

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O1

void lws_dll2_add_before(lws_dll2 *d,lws_dll2 *after)

{
  lws_dll2 *plVar1;
  lws_dll2 *plVar2;
  
  if (d->owner != (lws_dll2_owner *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                  ,0x51,"void lws_dll2_add_before(struct lws_dll2 *, struct lws_dll2 *)");
  }
  plVar1 = (lws_dll2 *)after->owner;
  if (plVar1 != (lws_dll2 *)0x0) {
    d->owner = (lws_dll2_owner *)plVar1;
    d->next = after;
    d->prev = after->prev;
    plVar2 = after->prev;
    if (after->prev == (lws_dll2 *)0x0) {
      plVar2 = plVar1;
    }
    plVar2->next = d;
    after->prev = d;
    *(uint32_t *)&plVar1->owner = *(uint32_t *)&plVar1->owner + 1;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                ,0x56,"void lws_dll2_add_before(struct lws_dll2 *, struct lws_dll2 *)");
}

Assistant:

void
lws_dll2_add_before(struct lws_dll2 *d, struct lws_dll2 *after)
{
	lws_dll2_owner_t *owner = after->owner;

	if (!lws_dll2_is_detached(d)) {
		assert(0); /* only wholly detached things can be added */
		return;
	}

	if (lws_dll2_is_detached(after)) {
		assert(0); /* can't add after something detached */
		return;
	}

	d->owner = owner;

	/* we need to point forward to after */

	d->next = after;

	/* we need to point back to after->prev */

	d->prev = after->prev;

	/* guy that used to point to after, needs to point to us */

	if (after->prev)
		after->prev->next = d;
	else
		owner->head = d;

	/* then after needs to point back to us */

	after->prev = d;

	owner->count++;
}